

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::AddLinkLibrary(cmOrderDirectories *this,string *fullPath)

{
  bool bVar1;
  value_type pcVar2;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  value_type local_90;
  uint local_84;
  value_type local_80;
  _Self local_78 [3];
  _Self local_60;
  undefined1 local_58 [8];
  string dir;
  string *fullPath_local;
  cmOrderDirectories *this_local;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->LinkExtensions);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->LinkExtensions.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmOrderDirectories.cxx"
                  ,0x168,"void cmOrderDirectories::AddLinkLibrary(const std::string &)");
  }
  pVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->EmmittedConstraintLibrary,fullPath);
  dir.field_2._8_8_ = pVar3.first._M_node;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->ImplicitDirectories);
    if (!bVar1) {
      cmsys::SystemTools::GetFilenamePath((string *)local_58,fullPath);
      local_60._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&this->ImplicitDirectories,(string *)local_58);
      local_78[0]._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->ImplicitDirectories);
      bVar1 = std::operator!=(&local_60,local_78);
      if (bVar1) {
        pcVar2 = (value_type)operator_new(0x80);
        cmOrderDirectoriesConstraintLibrary::cmOrderDirectoriesConstraintLibrary
                  ((cmOrderDirectoriesConstraintLibrary *)pcVar2,this,fullPath);
        local_80 = pcVar2;
        std::vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
        ::push_back(&this->ImplicitDirEntries,&local_80);
      }
      local_84 = (uint)bVar1;
      std::__cxx11::string::~string((string *)local_58);
      if (local_84 != 0) {
        return;
      }
    }
    pcVar2 = (value_type)operator_new(0x80);
    cmOrderDirectoriesConstraintLibrary::cmOrderDirectoriesConstraintLibrary
              ((cmOrderDirectoriesConstraintLibrary *)pcVar2,this,fullPath);
    local_90 = pcVar2;
    std::vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>::
    push_back(&this->ConstraintEntries,&local_90);
  }
  return;
}

Assistant:

void cmOrderDirectories::AddLinkLibrary(std::string const& fullPath)
{
  // Link extension info is required for library constraints.
  assert(!this->LinkExtensions.empty());

  // Add the link library at most once.
  if(this->EmmittedConstraintLibrary.insert(fullPath).second)
    {
    // Implicit link directories need special handling.
    if(!this->ImplicitDirectories.empty())
      {
      std::string dir = cmSystemTools::GetFilenamePath(fullPath);
      if(this->ImplicitDirectories.find(dir) !=
         this->ImplicitDirectories.end())
        {
        this->ImplicitDirEntries.push_back(
          new cmOrderDirectoriesConstraintLibrary(this, fullPath));
        return;
        }
      }

    // Construct the link library entry.
    this->ConstraintEntries.push_back(
      new cmOrderDirectoriesConstraintLibrary(this, fullPath));
    }
}